

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QPersistentModelIndex>::emplace<QPersistentModelIndex>
          (QMovableArrayOps<QPersistentModelIndex> *this,qsizetype i,QPersistentModelIndex *args)

{
  qsizetype *pqVar1;
  QPersistentModelIndex **ppQVar2;
  Data *pDVar3;
  QPersistentModelIndex *pQVar4;
  long lVar5;
  QPersistentModelIndexData *pQVar6;
  QPersistentModelIndex QVar7;
  qsizetype qVar8;
  long in_FS_OFFSET;
  bool bVar9;
  Inserter local_60;
  QPersistentModelIndex local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QPersistentModelIndex>).
           super_QArrayDataPointer<QPersistentModelIndex>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QPersistentModelIndex>).
        super_QArrayDataPointer<QPersistentModelIndex>.size == i) {
      qVar8 = QArrayDataPointer<QPersistentModelIndex>::freeSpaceAtEnd
                        ((QArrayDataPointer<QPersistentModelIndex> *)this);
      if (qVar8 != 0) {
        pQVar4 = (this->super_QGenericArrayOps<QPersistentModelIndex>).
                 super_QArrayDataPointer<QPersistentModelIndex>.ptr;
        lVar5 = (this->super_QGenericArrayOps<QPersistentModelIndex>).
                super_QArrayDataPointer<QPersistentModelIndex>.size;
        pQVar6 = args->d;
        args->d = (QPersistentModelIndexData *)0x0;
        pQVar4[lVar5].d = pQVar6;
        (this->super_QGenericArrayOps<QPersistentModelIndex>).
        super_QArrayDataPointer<QPersistentModelIndex>.size = lVar5 + 1;
        goto LAB_001489ac;
      }
    }
    if (i == 0) {
      qVar8 = QArrayDataPointer<QPersistentModelIndex>::freeSpaceAtBegin
                        ((QArrayDataPointer<QPersistentModelIndex> *)this);
      if (qVar8 != 0) {
        pQVar4 = (this->super_QGenericArrayOps<QPersistentModelIndex>).
                 super_QArrayDataPointer<QPersistentModelIndex>.ptr;
        pQVar6 = args->d;
        args->d = (QPersistentModelIndexData *)0x0;
        pQVar4[-1].d = pQVar6;
        ppQVar2 = &(this->super_QGenericArrayOps<QPersistentModelIndex>).
                   super_QArrayDataPointer<QPersistentModelIndex>.ptr;
        *ppQVar2 = *ppQVar2 + -1;
        pqVar1 = &(this->super_QGenericArrayOps<QPersistentModelIndex>).
                  super_QArrayDataPointer<QPersistentModelIndex>.size;
        *pqVar1 = *pqVar1 + 1;
        goto LAB_001489ac;
      }
    }
  }
  pQVar6 = args->d;
  args->d = (QPersistentModelIndexData *)0x0;
  bVar9 = (this->super_QGenericArrayOps<QPersistentModelIndex>).
          super_QArrayDataPointer<QPersistentModelIndex>.size != 0;
  local_38.d = pQVar6;
  QArrayDataPointer<QPersistentModelIndex>::detachAndGrow
            ((QArrayDataPointer<QPersistentModelIndex> *)this,(uint)(i == 0 && bVar9),1,
             (QPersistentModelIndex **)0x0,(QArrayDataPointer<QPersistentModelIndex> *)0x0);
  if (i == 0 && bVar9) {
    pQVar4 = (this->super_QGenericArrayOps<QPersistentModelIndex>).
             super_QArrayDataPointer<QPersistentModelIndex>.ptr;
    local_38.d = (QPersistentModelIndexData *)0x0;
    pQVar4[-1].d = pQVar6;
    (this->super_QGenericArrayOps<QPersistentModelIndex>).
    super_QArrayDataPointer<QPersistentModelIndex>.ptr = pQVar4 + -1;
    pqVar1 = &(this->super_QGenericArrayOps<QPersistentModelIndex>).
              super_QArrayDataPointer<QPersistentModelIndex>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  else {
    Inserter::Inserter(&local_60,(QArrayDataPointer<QPersistentModelIndex> *)this,i,1);
    QVar7.d = local_38.d;
    local_38.d = (QPersistentModelIndexData *)0x0;
    (local_60.displaceFrom)->d = QVar7.d;
    local_60.displaceFrom = local_60.displaceFrom + 1;
    Inserter::~Inserter(&local_60);
  }
  QPersistentModelIndex::~QPersistentModelIndex(&local_38);
LAB_001489ac:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }